

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool __thiscall
libwebm::Webm2Pes::ReadVideoFrame(Webm2Pes *this,Frame *mkvparser_frame,VideoFrame *frame)

{
  ulong length;
  bool bVar1;
  long lVar2;
  
  length = mkvparser_frame->len;
  if (frame != (VideoFrame *)0x0 && 0 < (long)length) {
    if (((frame->buffer_).capacity < length) && (bVar1 = VideoFrame::Init(frame,length * 2), !bVar1)
       ) {
      ReadVideoFrame();
      return false;
    }
    lVar2 = mkvparser::Block::Frame::Read
                      (mkvparser_frame,&(this->webm_reader_).super_IMkvReader,
                       (uchar *)(frame->buffer_).data._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>);
    if (lVar2 == 0) {
      bVar1 = VideoFrame::SetBufferLength(frame,length);
      return bVar1;
    }
    ReadVideoFrame();
  }
  return false;
}

Assistant:

bool Webm2Pes::ReadVideoFrame(const mkvparser::Block::Frame& mkvparser_frame,
                              VideoFrame* frame) {
  if (mkvparser_frame.len < 1 || frame == nullptr)
    return false;

  const std::size_t mkv_len = static_cast<std::size_t>(mkvparser_frame.len);
  if (mkv_len > frame->buffer().capacity) {
    const std::size_t new_size = 2 * mkv_len;
    if (frame->Init(new_size) == false) {
      std::fprintf(stderr, "Webm2Pes: Out of memory.\n");
      return false;
    }
  }
  if (mkvparser_frame.Read(&webm_reader_, frame->buffer().data.get()) != 0) {
    std::fprintf(stderr, "Webm2Pes: Error reading VPx frame!\n");
    return false;
  }
  return frame->SetBufferLength(mkv_len);
}